

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.cc
# Opt level: O3

void __thiscall iqxmlrpc::http::Packet::~Packet(Packet *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  this->_vptr_Packet = (_func_int **)&PTR__Packet_00188cb0;
  pcVar2 = (this->content_)._M_dataplus._M_p;
  paVar1 = &(this->content_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  boost::detail::shared_count::~shared_count(&(this->header_).pn);
  return;
}

Assistant:

Packet::~Packet()
{
}